

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_sourcePosition_primitive_equals
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  _Bool local_49;
  sysbvm_sourcePosition_t *rightSourcePosition;
  sysbvm_sourcePosition_t *leftSourcePosition;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar1 = sysbvm_tuple_getType(context,*arguments);
  sVar2 = sysbvm_tuple_getType(context,arguments[1]);
  if (sVar1 == sVar2) {
    sVar1 = *arguments;
    sVar2 = arguments[1];
    local_49 = false;
    if ((*(long *)(sVar1 + 0x10) == *(long *)(sVar2 + 0x10)) &&
       (local_49 = false, *(long *)(sVar1 + 0x18) == *(long *)(sVar2 + 0x18))) {
      local_49 = *(long *)(sVar1 + 0x20) == *(long *)(sVar2 + 0x20);
    }
    context_local = (sysbvm_context_t *)sysbvm_tuple_boolean_encode(local_49);
  }
  else {
    context_local = (sysbvm_context_t *)0xf;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourcePosition_primitive_equals(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)argumentCount;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    if(sysbvm_tuple_getType(context, arguments[0]) != sysbvm_tuple_getType(context, arguments[1]))
        return SYSBVM_FALSE_TUPLE;

    sysbvm_sourcePosition_t *leftSourcePosition = (sysbvm_sourcePosition_t*)arguments[0];
    sysbvm_sourcePosition_t *rightSourcePosition = (sysbvm_sourcePosition_t*)arguments[1];

    return sysbvm_tuple_boolean_encode(
        leftSourcePosition->sourceCode == rightSourcePosition->sourceCode &&
        leftSourcePosition->startIndex == rightSourcePosition->startIndex &&
        leftSourcePosition->endIndex == rightSourcePosition->endIndex
    );
}